

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

uint __thiscall
ON_SubDFace::GetEdgeArray(ON_SubDFace *this,ON_SimpleArray<ON_SubDEdgePtr> *face_edge_array)

{
  ushort uVar1;
  int iVar2;
  uint count;
  
  if (-1 < (long)face_edge_array->m_capacity) {
    face_edge_array->m_count = 0;
  }
  uVar1 = this->m_edge_count;
  if ((ulong)(long)face_edge_array->m_capacity < (ulong)uVar1) {
    ON_SimpleArray<ON_SubDEdgePtr>::SetCapacity(face_edge_array,(ulong)uVar1);
  }
  count = 4;
  if (uVar1 < 5) {
    count = (uint)uVar1;
  }
  ON_SimpleArray<ON_SubDEdgePtr>::Append(face_edge_array,count,this->m_edge4);
  if (4 < uVar1) {
    if (this->m_edgex == (ON_SubDEdgePtr *)0x0) {
      iVar2 = uVar1 - 4;
      do {
        ON_SimpleArray<ON_SubDEdgePtr>::Append(face_edge_array,&ON_SubDEdgePtr::Null);
        iVar2 = iVar2 + -1;
      } while (iVar2 != 0);
    }
    else {
      ON_SimpleArray<ON_SubDEdgePtr>::Append(face_edge_array,uVar1 - 4,this->m_edgex);
    }
  }
  return (uint)uVar1;
}

Assistant:

unsigned int ON_SubDFace::GetEdgeArray(
  ON_SimpleArray< ON_SubDEdgePtr >& face_edge_array
) const
{
  face_edge_array.SetCount(0);
  const unsigned edge_count = m_edge_count;
  face_edge_array.Reserve(edge_count);
  face_edge_array.Append(edge_count <= 4 ? edge_count : 4U, m_edge4);
  if (edge_count > 4)
  {
    if ( nullptr != m_edgex )
     face_edge_array.Append(edge_count-4U, m_edgex);
    else
    {
      for (unsigned fei = 4; fei < edge_count; ++fei)
        face_edge_array.Append(ON_SubDEdgePtr::Null);
    }
  }
  return edge_count;
}